

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O3

void PostProcess(Mat *frame,vector<cv::Mat,_std::allocator<cv::Mat>_> *outs,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *classes,double *confThreshold,double *nmsThreshold)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  _InputArray *p_Var2;
  pointer pMVar3;
  pointer pMVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  undefined8 *puVar9;
  int iVar10;
  int iVar11;
  Point classIdPoint;
  double confidence;
  vector<float,_std::allocator<float>_> confidences;
  vector<int,_std::allocator<int>_> classIds;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> boxes;
  Rect box;
  vector<int,_std::allocator<int>_> indices;
  Range local_1b8;
  Range local_1b0;
  vector<float,_std::allocator<float>_> local_1a8;
  void *local_188;
  iterator iStack_180;
  int *local_178;
  Mat *local_168;
  double *local_160;
  void *local_158;
  undefined8 uStack_150;
  long local_148;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_140;
  double *local_138;
  ulong local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  _InputArray local_f8 [4];
  Range local_98;
  Range RStack_90;
  long local_88;
  
  local_188 = (void *)0x0;
  iStack_180._M_current = (int *)0x0;
  local_178 = (int *)0x0;
  local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (float *)0x0;
  local_148 = 0;
  local_158 = (void *)0x0;
  uStack_150 = 0;
  pMVar3 = (outs->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pMVar4 = (outs->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_160 = confThreshold;
  local_140 = classes;
  local_138 = nmsThreshold;
  if (pMVar4 != pMVar3) {
    uVar7 = 0;
    local_168 = frame;
    do {
      lVar8 = uVar7 * 0x60;
      if (0 < *(int *)(pMVar3 + lVar8 + 8)) {
        puVar9 = *(undefined8 **)(pMVar3 + lVar8 + 0x10);
        local_98.start = 0;
        local_130 = uVar7;
        do {
          iVar5 = local_98.start + 1;
          local_98.end = iVar5;
          local_1b8.start = -0x80000000;
          local_1b8.end = 0x7fffffff;
          cv::Mat::Mat((Mat *)local_f8,pMVar3 + lVar8,&local_98,&local_1b8);
          local_1b0.end =
               *(int *)((outs->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
                        super__Vector_impl_data._M_start + lVar8 + 0xc);
          local_1b8.start = -0x80000000;
          local_1b8.end = 0x7fffffff;
          local_1b0.start = 5;
          cv::Mat::Mat((Mat *)&local_98,(Mat *)local_f8,&local_1b8,&local_1b0);
          cv::Mat::~Mat((Mat *)local_f8);
          local_1b8.start = 0;
          local_1b8.end = 0;
          local_f8[0].sz.width = 0;
          local_f8[0].sz.height = 0;
          local_f8[0].flags = 0x1010000;
          local_f8[0].obj = &local_98;
          p_Var2 = (_InputArray *)cv::noArray();
          cv::minMaxLoc(local_f8,(double *)0x0,(double *)&local_1b0,(Point_ *)0x0,
                        (Point_ *)&local_1b8,p_Var2);
          if (*local_160 <= (double)CONCAT44(local_1b0.end,local_1b0.start) &&
              (double)CONCAT44(local_1b0.end,local_1b0.start) != *local_160) {
            local_128 = *(undefined8 *)(local_168 + 8);
            uStack_120 = 0;
            local_118 = *puVar9;
            uStack_110 = 0;
            local_108 = puVar9[1];
            uStack_100 = 0;
            if (iStack_180._M_current == local_178) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_188,iStack_180,&local_1b8.start);
            }
            else {
              *iStack_180._M_current = local_1b8.start;
              iStack_180._M_current = iStack_180._M_current + 1;
            }
            local_f8[0].flags = (int)(float)(double)CONCAT44(local_1b0.end,local_1b0.start);
            if (local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                        (&local_1a8,
                         (iterator)
                         local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish,(float *)local_f8);
            }
            else {
              *local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish =
                   (float)(double)CONCAT44(local_1b0.end,local_1b0.start);
              local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            iVar10 = (int)((float)local_108 * (float)local_128._4_4_);
            iVar11 = (int)(local_108._4_4_ * (float)(int)local_128);
            local_f8[0].flags = (int)((float)local_118 * (float)local_128._4_4_) - iVar10 / 2;
            local_f8[0]._4_4_ = (int)(local_118._4_4_ * (float)(int)local_128) - iVar11 / 2;
            local_f8[0].obj = (void *)CONCAT44(iVar11,iVar10);
            std::vector<cv::Rect_<int>,std::allocator<cv::Rect_<int>>>::emplace_back<cv::Rect_<int>>
                      ((vector<cv::Rect_<int>,std::allocator<cv::Rect_<int>>> *)&local_158,
                       (Rect_<int> *)local_f8);
          }
          cv::Mat::~Mat((Mat *)&local_98);
          pMVar3 = (outs->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          puVar9 = (undefined8 *)((long)puVar9 + (long)*(int *)(pMVar3 + lVar8 + 0xc) * 4);
          local_98.start = iVar5;
        } while (iVar5 < *(int *)(pMVar3 + lVar8 + 8));
        pMVar4 = (outs->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        frame = local_168;
        uVar7 = local_130;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)(((long)pMVar4 - (long)pMVar3 >> 5) * -0x5555555555555555));
  }
  local_98.start = 0;
  local_98.end = 0;
  RStack_90.start = 0;
  RStack_90.end = 0;
  local_88 = 0;
  cv::dnn::dnn4_v20211004::NMSBoxes
            ((vector *)&local_158,(vector *)&local_1a8,(float)*local_160,(float)*local_138,
             (vector *)&local_98,1.0,0);
  pvVar1 = local_140;
  if (RStack_90 != local_98) {
    uVar7 = 0;
    do {
      lVar6 = (long)*(int *)((long)local_98 + uVar7 * 4);
      lVar8 = lVar6 * 0x10;
      local_f8[0]._4_4_ = *(int *)((long)local_158 + lVar8 + 4);
      local_f8[0].flags = *(int *)((long)local_158 + lVar8);
      iVar5 = *(int *)((long)local_158 + lVar8 + 8);
      local_1b0.start = *(int *)((long)local_158 + lVar8 + 0xc);
      local_f8[0].obj = (void *)CONCAT44(local_1b0.start,iVar5);
      local_1b8.start = iVar5 + *(int *)((long)local_158 + lVar8);
      local_1b0.start = local_1b0.start + local_f8[0]._4_4_;
      DrawPred((pvVar1->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + *(int *)((long)local_188 + lVar6 * 4),
               local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start + lVar6,&local_f8[0].flags,
               (int *)&local_f8[0].field_0x4,&local_1b8.start,&local_1b0.start,frame);
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)((long)RStack_90 - (long)local_98 >> 2));
  }
  if (local_98 != (Range)0x0) {
    operator_delete((void *)local_98,local_88 - (long)local_98);
  }
  if (local_158 != (void *)0x0) {
    operator_delete(local_158,local_148 - (long)local_158);
  }
  if (local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_188 != (void *)0x0) {
    operator_delete(local_188,(long)local_178 - (long)local_188);
  }
  return;
}

Assistant:

void PostProcess(cv::Mat& frame, std::vector<cv::Mat> const& outs, std::vector<std::string> const& classes,
    double const& confThreshold, double const& nmsThreshold) noexcept {
  std::vector<int> classIds;
  std::vector<float> confidences;
  std::vector<cv::Rect> boxes;
  
  for (size_t i = 0; i < outs.size(); ++i) {
    /** Scan through all the bounding boxes output from the network and keep only the
     * ones with high confidence scores. Assign the box's class label as the class
     * with the highest score for the box.*/
    float* data = (float*)outs[i].data;
    for (int j = 0; j < outs[i].rows; ++j, data += outs[i].cols) {
      cv::Mat scores = outs[i].row(j).colRange(5, outs[i].cols);
      cv::Point classIdPoint;
      double confidence;
      //! Get the value and location of the maximum score
      cv::minMaxLoc(scores, 0, &confidence, 0, &classIdPoint);
      if (confidence > confThreshold) {
        int centerX = (int)(data[0] * frame.cols);
        int centerY = (int)(data[1] * frame.rows);
        int width = (int)(data[2] * frame.cols);
        int height = (int)(data[3] * frame.rows);
        int left = centerX - width / 2;
        int top = centerY - height / 2;
      
        classIds.push_back(classIdPoint.x);
        confidences.push_back((float)confidence);
        boxes.push_back(cv::Rect(left, top, width, height));
      }
    }
  }
  
  /** Perform non maximum suppression to eliminate redundant overlapping boxes with
   * lower confidences */
  std::vector<int> indices;
  cv::dnn::NMSBoxes(boxes, confidences, confThreshold, nmsThreshold, indices);
  for (size_t i = 0; i < indices.size(); ++i) {
    int idx = indices[i];
    cv::Rect box = boxes[idx];
    DrawPred(classes[classIds[idx]], confidences[idx], box.x, box.y,
        box.x + box.width, box.y + box.height, frame);
  }
}